

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

void Abc_NtkDelayTraceSortPins(Abc_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode_00;
  float fVar3;
  int local_34;
  int temp;
  int best_i;
  int j;
  int i;
  Abc_Obj_t *pFanin;
  float *pPinDelays_local;
  int *pPinPerm_local;
  Abc_Obj_t *pNode_local;
  
  for (best_i = 0; iVar1 = Abc_ObjFaninNum(pNode), best_i < iVar1; best_i = best_i + 1) {
    pNode_00 = Abc_ObjFanin(pNode,best_i);
    pPinPerm[best_i] = best_i;
    fVar3 = Abc_ObjArrival(pNode_00);
    pPinDelays[best_i] = fVar3;
  }
  for (best_i = 0; iVar1 = Abc_ObjFaninNum(pNode), best_i < iVar1 + -1; best_i = best_i + 1) {
    local_34 = best_i;
    temp = best_i;
    while( true ) {
      temp = temp + 1;
      iVar1 = Abc_ObjFaninNum(pNode);
      if (iVar1 <= temp) break;
      if (pPinDelays[pPinPerm[local_34]] <= pPinDelays[pPinPerm[temp]] &&
          pPinDelays[pPinPerm[temp]] != pPinDelays[pPinPerm[local_34]]) {
        local_34 = temp;
      }
    }
    if (local_34 != best_i) {
      iVar1 = pPinPerm[best_i];
      pPinPerm[best_i] = pPinPerm[local_34];
      pPinPerm[local_34] = iVar1;
    }
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if ((iVar1 != 0) && (iVar1 = *pPinPerm, iVar2 = Abc_ObjFaninNum(pNode), iVar2 <= iVar1)) {
    __assert_fail("Abc_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Abc_ObjFaninNum(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                  ,0x51,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
  }
  best_i = 1;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pNode);
    if (iVar1 <= best_i) {
      return;
    }
    iVar1 = pPinPerm[best_i];
    iVar2 = Abc_ObjFaninNum(pNode);
    if (iVar2 <= iVar1) break;
    if (pPinDelays[pPinPerm[best_i + -1]] < pPinDelays[pPinPerm[best_i]]) {
      __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                    ,0x55,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
    }
    best_i = best_i + 1;
  }
  __assert_fail("pPinPerm[i] < Abc_ObjFaninNum(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                ,0x54,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
}

Assistant:

void Abc_NtkDelayTraceSortPins( Abc_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Abc_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Abc_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Abc_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Abc_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Abc_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Abc_ObjFaninNum(pNode) );
    for ( i = 1; i < Abc_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Abc_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}